

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execAndiRg<(moira::Instr)60,(moira::Mode)0,(moira::Size)2>(Moira *this,u16 opcode)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  u32 uVar4;
  
  uVar1 = (this->queue).irc;
  readExt(this);
  uVar2 = *(ushort *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x58);
  uVar3 = uVar2 ^ uVar1;
  (this->reg).sr.n = SUB21(uVar3 >> 0xf,0);
  (this->reg).sr.z = uVar2 == uVar1;
  (this->reg).sr.v = false;
  (this->reg).sr.c = false;
  uVar4 = (this->reg).pc;
  (this->reg).pc0 = uVar4;
  (this->queue).ird = (this->queue).irc;
  uVar4 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar4 + 2);
  (this->queue).irc = (u16)uVar4;
  *(ushort *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x58) = uVar3;
  return;
}

Assistant:

void
Moira::execAndiRg(u16 opcode)
{
    u32 src = readI<S>();
    int dst = _____________xxx(opcode);

    u32 result = logic<I,S>(src, readD<S>(dst));
    prefetch<POLLIPL>();

    if (S == Long) sync(4);
    writeD<S>(dst, result);
}